

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

char * Cba_ManGetSliceName(Cba_Ntk_t *p,int iFon,int RangeId)

{
  char cVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  Vec_Str_t *p_00;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  
  if (RangeId == 0) {
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    if (RangeId < 0) {
LAB_0034e81a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    pVVar2 = p->pDesign->vHash->vObjs;
    uVar8 = RangeId * 4;
    uVar9 = pVVar2->nSize;
    if (uVar9 == uVar8 || SBORROW4(uVar9,uVar8) != (int)(uVar9 + RangeId * -4) < 0)
    goto LAB_0034e81a;
    piVar3 = pVVar2->pArray;
    uVar9 = piVar3[uVar8];
    uVar8 = piVar3[(ulong)uVar8 + 1];
  }
  if ((p->vFonName).nSize < 1) {
    pcVar5 = "Cba_NtkHasFonNames(p)";
LAB_0034e849:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
  }
  if (iFon < 1) {
    pcVar5 = "Cba_FonIsReal(f)";
    goto LAB_0034e849;
  }
  iVar4 = Vec_IntGetEntry(&p->vFonName,iFon);
  pcVar5 = Abc_NamStr(p->pDesign->pStrs,iVar4);
  if ((p->vFonName).nSize < 1) {
    __assert_fail("Cba_NtkHasFonNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
  }
  iVar4 = Vec_IntGetEntry(&p->vFonName,iFon);
  if (pcVar5 == (char *)0x0) {
LAB_0034e7fb:
    __assert_fail("pName != NULL && *pName != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                  ,0x15d,"int Cba_NameIsLegalInVerilog(char *, int)");
  }
  cVar1 = *pcVar5;
  if (cVar1 != '\\') {
    if (cVar1 == '\0') goto LAB_0034e7fb;
    if ((iVar4 < 0xd) ||
       (((byte)(cVar1 + 0x85U) < 0xe6 && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))))) {
LAB_0034e727:
      p_00 = Abc_NamBuffer(p->pDesign->pStrs);
      if (uVar9 != uVar8) {
        pcVar10 = "\\%s [%d:%d]";
        goto LAB_0034e7db;
      }
      pcVar10 = "\\%s [%d]";
      goto LAB_0034e7ae;
    }
    bVar7 = pcVar5[1];
    if (bVar7 != 0) {
      pbVar6 = (byte *)(pcVar5 + 2);
      do {
        if (((((byte)(bVar7 - 0x3a) < 0xf6) && ((byte)((bVar7 & 0xdf) + 0xa5) < 0xe6)) &&
            (bVar7 != 0x5f)) && (bVar7 != 0x24)) goto LAB_0034e727;
        bVar7 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar7 != 0);
    }
  }
  p_00 = Abc_NamBuffer(p->pDesign->pStrs);
  if (uVar9 != uVar8) {
    pcVar10 = "%s[%d:%d]";
LAB_0034e7db:
    pcVar5 = Vec_StrPrintF(p_00,pcVar10,pcVar5,(ulong)uVar9,(ulong)uVar8);
    return pcVar5;
  }
  pcVar10 = "%s[%d]";
LAB_0034e7ae:
  pcVar5 = Vec_StrPrintF(p_00,pcVar10,pcVar5,(ulong)uVar9);
  return pcVar5;
}

Assistant:

char * Cba_ManGetSliceName( Cba_Ntk_t * p, int iFon, int RangeId )
{
    int Left  = Cba_NtkRangeLeft(p, RangeId);
    int Right = Cba_NtkRangeRight(p, RangeId);
    char * pName = Cba_FonNameStr(p, iFon);
    if ( Cba_NameIsLegalInVerilog(pName, Cba_FonName(p, iFon)) )
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d:%d]", pName, Left, Right );
    else
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d:%d]", pName, Left, Right );
}